

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

void clear_all(hash_table *p_hash_table)

{
  int i;
  long lVar1;
  
  if (p_hash_table->p_lookup_table != (Vector **)0x0) {
    for (lVar1 = 0; lVar1 != 0x80000; lVar1 = lVar1 + 1) {
      if (p_hash_table->p_lookup_table[lVar1] != (Vector *)0x0) {
        aom_vector_destroy(p_hash_table->p_lookup_table[lVar1]);
        aom_free(p_hash_table->p_lookup_table[lVar1]);
        p_hash_table->p_lookup_table[lVar1] = (Vector *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void clear_all(hash_table *p_hash_table) {
  if (p_hash_table->p_lookup_table == NULL) {
    return;
  }
  for (int i = 0; i < kMaxAddr; i++) {
    if (p_hash_table->p_lookup_table[i] != NULL) {
      aom_vector_destroy(p_hash_table->p_lookup_table[i]);
      aom_free(p_hash_table->p_lookup_table[i]);
      p_hash_table->p_lookup_table[i] = NULL;
    }
  }
}